

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftbitmap.c
# Opt level: O2

FT_Error FT_Bitmap_Embolden(FT_Library library,FT_Bitmap *bitmap,FT_Pos xStrength,FT_Pos yStrength)

{
  byte bVar1;
  byte bVar2;
  FT_Error FVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  long lVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  int iVar11;
  uchar *out;
  byte *pbVar12;
  byte *pbVar13;
  uchar *puVar14;
  FT_Memory memory;
  byte *__s;
  uchar *puVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uchar *in;
  uchar *__src;
  uint uVar20;
  long lVar21;
  uint uVar22;
  int iVar23;
  uchar *limit;
  byte *pbVar24;
  long lVar25;
  bool bVar26;
  FT_Bitmap tmp;
  
  if (library == (FT_Library)0x0) {
    return 0x21;
  }
  if (bitmap == (FT_Bitmap *)0x0) {
    return 6;
  }
  if (bitmap->buffer == (uchar *)0x0) {
    return 6;
  }
  if (0x1fffffffdf < yStrength || 0x1fffffffdf < xStrength) {
    return 6;
  }
  uVar22 = (int)xStrength + 0x20;
  uVar10 = (int)yStrength + 0x20;
  if ((uVar10 | uVar22) < 0x40) goto LAB_0017e5e6;
  iVar23 = (int)uVar22 >> 6;
  iVar11 = (int)uVar10 >> 6;
  if ((int)(uVar10 | uVar22) >> 6 < 0) {
    return 6;
  }
  uVar10 = (uint)bitmap->pixel_mode;
  iVar4 = 8;
  FVar3 = 0;
  switch(uVar10) {
  case 1:
    iVar5 = iVar4;
    if (iVar23 < 8) {
      iVar5 = iVar23;
    }
    memory = library->memory;
    uVar20 = bitmap->rows;
    uVar18 = bitmap->width;
    uVar22 = bitmap->pitch;
    uVar10 = -uVar22;
    if (0 < (int)uVar22) {
      uVar10 = uVar22;
    }
    uVar17 = (ulong)uVar10;
    goto switchD_0017e236_caseD_1;
  case 3:
  case 4:
    tmp.buffer = (uchar *)0x0;
    tmp.num_grays = 0;
    tmp.pixel_mode = '\0';
    tmp.palette_mode = '\0';
    tmp._28_4_ = 0;
    tmp.rows = 0;
    tmp.width = 0;
    tmp.pitch = 0;
    tmp._12_4_ = 0;
    tmp.palette = (void *)0x0;
    FVar3 = FT_Bitmap_Convert(library,bitmap,&tmp,1);
    if (FVar3 != 0) {
      return FVar3;
    }
    FT_Bitmap_Done(library,bitmap);
    bitmap->rows = tmp.rows;
    bitmap->width = tmp.width;
    bitmap->pitch = tmp.pitch;
    *(undefined4 *)&bitmap->field_0xc = tmp._12_4_;
    bitmap->buffer = tmp.buffer;
    bitmap->num_grays = tmp.num_grays;
    bitmap->pixel_mode = tmp.pixel_mode;
    bitmap->palette_mode = tmp.palette_mode;
    *(undefined4 *)&bitmap->field_0x1c = tmp._28_4_;
    bitmap->palette = tmp.palette;
    uVar10 = (uint)bitmap->pixel_mode;
    break;
  case 5:
    iVar23 = iVar23 * 3;
    goto LAB_0017e299;
  case 6:
    iVar11 = iVar11 * 3;
LAB_0017e299:
    memory = library->memory;
    uVar20 = bitmap->rows;
    uVar18 = bitmap->width;
    uVar22 = bitmap->pitch;
    uVar17 = (ulong)-uVar22;
    if (0 < (int)uVar22) {
      uVar17 = (ulong)uVar22;
    }
    goto switchD_0017e236_caseD_2;
  case 7:
    goto switchD_0017e1a3_caseD_7;
  }
  uVar22 = bitmap->pitch;
  uVar20 = -uVar22;
  if (0 < (int)uVar22) {
    uVar20 = uVar22;
  }
  uVar17 = (ulong)uVar20;
  if (uVar10 - 1 < 6) {
    memory = library->memory;
    uVar20 = bitmap->rows;
    uVar18 = bitmap->width;
    iVar5 = iVar23;
    switch(uVar10) {
    case 1:
switchD_0017e236_caseD_1:
      uVar10 = uVar18 + iVar5 + 7 >> 3;
      iVar4 = 1;
      iVar23 = iVar5;
      break;
    default:
switchD_0017e236_caseD_2:
      uVar10 = uVar18 + iVar23;
      break;
    case 3:
      uVar10 = uVar18 + iVar23 + 3 >> 2;
      iVar4 = 2;
      break;
    case 4:
      uVar10 = uVar18 + iVar23 + 1 >> 1;
      iVar4 = 4;
    }
    uVar16 = (uint)uVar17;
    if ((iVar11 == 0) && (uVar10 <= uVar16)) {
      uVar10 = iVar4 * (uVar18 + iVar23);
      if (uVar10 < uVar16 << 3) {
        pbVar24 = bitmap->buffer + (uVar10 >> 3);
        pbVar12 = bitmap->buffer + uVar17;
        pbVar13 = pbVar12;
        while (bVar26 = uVar20 != 0, uVar20 = uVar20 - 1, bVar26) {
          __s = pbVar24;
          if ((uVar10 & 7) != 0) {
            *pbVar24 = *pbVar24 & (byte)(0xff00 >> (sbyte)(uVar10 & 7));
            __s = pbVar24 + 1;
          }
          if (__s < pbVar13) {
            memset(__s,0,(long)pbVar12 - (long)__s);
          }
          pbVar24 = pbVar24 + uVar17;
          pbVar12 = pbVar12 + uVar17;
          pbVar13 = pbVar13 + uVar17;
        }
        uVar22 = bitmap->pitch;
      }
    }
    else {
      puVar15 = (uchar *)ft_mem_qrealloc(memory,(ulong)uVar10,0,(ulong)(uVar20 + iVar11),(void *)0x0
                                         ,(FT_Error *)&tmp);
      if (tmp.rows != 0) {
        return tmp.rows;
      }
      __src = bitmap->buffer;
      puVar6 = __src + uVar16 * bitmap->rows;
      uVar8 = (ulong)(iVar4 * uVar18 + 7 >> 3);
      uVar19 = (ulong)(uVar10 - uVar16);
      puVar14 = puVar15;
      if (bitmap->pitch < 1) {
        for (; __src < puVar6; __src = __src + uVar17) {
          memcpy(puVar14,__src,uVar8);
          memset(puVar14 + uVar17,0,uVar19);
          puVar14 = puVar14 + uVar17 + uVar19;
        }
        memset(puVar14,0,(ulong)(uVar10 * iVar11));
      }
      else {
        memset(puVar15,0,(ulong)(uVar10 * iVar11));
        puVar14 = puVar15 + uVar10 * iVar11;
        for (; __src < puVar6; __src = __src + uVar17) {
          memcpy(puVar14,__src,uVar8);
          memset(puVar14 + uVar17,0,uVar19);
          puVar14 = puVar14 + uVar17 + uVar19;
        }
      }
      ft_mem_free(memory,bitmap->buffer);
      bitmap->buffer = puVar15;
      uVar22 = -uVar10;
      if (-1 < bitmap->pitch) {
        uVar22 = uVar10;
      }
      bitmap->pitch = uVar22;
    }
    if ((int)uVar22 < 1) {
      uVar22 = -uVar22;
      uVar10 = (bitmap->rows - 1) * uVar22;
    }
    else {
      uVar10 = uVar22 * iVar11;
    }
    puVar15 = bitmap->buffer + uVar10;
    uVar17 = (ulong)uVar22;
    for (uVar10 = 0; uVar8 = uVar17, lVar25 = uVar17 - 2, uVar10 < bitmap->rows; uVar10 = uVar10 + 1
        ) {
      while (0 < (long)uVar8) {
        uVar19 = uVar8 - 1;
        bVar1 = puVar15[uVar8 - 1];
        uVar22 = (uint)bVar1;
        bVar2 = 7;
        lVar21 = lVar25;
        for (lVar7 = 1; lVar7 <= iVar23; lVar7 = lVar7 + 1) {
          if (bitmap->pixel_mode == '\x01') {
            bVar9 = (byte)uVar22 | bVar1 >> ((byte)lVar7 & 0x1f);
            uVar22 = (uint)bVar9;
            puVar15[uVar8 - 1] = bVar9;
            if (uVar8 != 1) {
              bVar9 = bVar9 | puVar15[uVar8 - 2] << (bVar2 & 0x1f);
              uVar22 = (uint)bVar9;
              puVar15[uVar8 - 1] = bVar9;
            }
          }
          else {
            if (lVar21 < 0) break;
            uVar22 = (uint)puVar15[lVar21] + (uVar22 & 0xff);
            if (bitmap->num_grays <= uVar22) {
              puVar15[uVar19] = (char)bitmap->num_grays + 0xff;
              break;
            }
            puVar15[uVar19] = (uchar)uVar22;
            if ((uVar22 & 0xff) == bitmap->num_grays - 1) break;
          }
          bVar2 = bVar2 - 1;
          lVar21 = lVar21 + -1;
        }
        uVar8 = uVar19;
        lVar25 = lVar25 + -1;
      }
      iVar4 = 1;
      while( true ) {
        iVar5 = bitmap->pitch;
        if (iVar11 < iVar4) break;
        for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
          puVar15[uVar8 - (long)(iVar5 * iVar4)] =
               puVar15[uVar8 - (long)(iVar5 * iVar4)] | puVar15[uVar8];
        }
        iVar4 = iVar4 + 1;
      }
      puVar15 = puVar15 + iVar5;
    }
    bitmap->width = bitmap->width + iVar23;
    bitmap->rows = bitmap->rows + iVar11;
LAB_0017e5e6:
    FVar3 = 0;
  }
  else {
    FVar3 = 0x12;
  }
switchD_0017e1a3_caseD_7:
  return FVar3;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Bitmap_Embolden( FT_Library  library,
                      FT_Bitmap*  bitmap,
                      FT_Pos      xStrength,
                      FT_Pos      yStrength )
  {
    FT_Error        error;
    unsigned char*  p;
    FT_Int          i, x, pitch;
    FT_UInt         y;
    FT_Int          xstr, ystr;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !bitmap || !bitmap->buffer )
      return FT_THROW( Invalid_Argument );

    if ( ( ( FT_PIX_ROUND( xStrength ) >> 6 ) > FT_INT_MAX ) ||
         ( ( FT_PIX_ROUND( yStrength ) >> 6 ) > FT_INT_MAX ) )
      return FT_THROW( Invalid_Argument );

    xstr = (FT_Int)FT_PIX_ROUND( xStrength ) >> 6;
    ystr = (FT_Int)FT_PIX_ROUND( yStrength ) >> 6;

    if ( xstr == 0 && ystr == 0 )
      return FT_Err_Ok;
    else if ( xstr < 0 || ystr < 0 )
      return FT_THROW( Invalid_Argument );

    switch ( bitmap->pixel_mode )
    {
    case FT_PIXEL_MODE_GRAY2:
    case FT_PIXEL_MODE_GRAY4:
      {
        FT_Bitmap  tmp;


        /* convert to 8bpp */
        FT_Bitmap_Init( &tmp );
        error = FT_Bitmap_Convert( library, bitmap, &tmp, 1 );
        if ( error )
          return error;

        FT_Bitmap_Done( library, bitmap );
        *bitmap = tmp;
      }
      break;

    case FT_PIXEL_MODE_MONO:
      if ( xstr > 8 )
        xstr = 8;
      break;

    case FT_PIXEL_MODE_LCD:
      xstr *= 3;
      break;

    case FT_PIXEL_MODE_LCD_V:
      ystr *= 3;
      break;

    case FT_PIXEL_MODE_BGRA:
      /* We don't embolden color glyphs. */
      return FT_Err_Ok;
    }

    error = ft_bitmap_assure_buffer( library->memory, bitmap,
                                     (FT_UInt)xstr, (FT_UInt)ystr );
    if ( error )
      return error;

    /* take care of bitmap flow */
    pitch = bitmap->pitch;
    if ( pitch > 0 )
      p = bitmap->buffer + pitch * ystr;
    else
    {
      pitch = -pitch;
      p = bitmap->buffer + (FT_UInt)pitch * ( bitmap->rows - 1 );
    }

    /* for each row */
    for ( y = 0; y < bitmap->rows; y++ )
    {
      /*
       * Horizontally:
       *
       * From the last pixel on, make each pixel or'ed with the
       * `xstr' pixels before it.
       */
      for ( x = pitch - 1; x >= 0; x-- )
      {
        unsigned char  tmp;


        tmp = p[x];
        for ( i = 1; i <= xstr; i++ )
        {
          if ( bitmap->pixel_mode == FT_PIXEL_MODE_MONO )
          {
            p[x] |= tmp >> i;

            /* the maximum value of 8 for `xstr' comes from here */
            if ( x > 0 )
              p[x] |= p[x - 1] << ( 8 - i );

#if 0
            if ( p[x] == 0xFF )
              break;
#endif
          }
          else
          {
            if ( x - i >= 0 )
            {
              if ( p[x] + p[x - i] > bitmap->num_grays - 1 )
              {
                p[x] = (unsigned char)( bitmap->num_grays - 1 );
                break;
              }
              else
              {
                p[x] = (unsigned char)( p[x] + p[x - i] );
                if ( p[x] == bitmap->num_grays - 1 )
                  break;
              }
            }
            else
              break;
          }
        }
      }

      /*
       * Vertically:
       *
       * Make the above `ystr' rows or'ed with it.
       */
      for ( x = 1; x <= ystr; x++ )
      {
        unsigned char*  q;


        q = p - bitmap->pitch * x;
        for ( i = 0; i < pitch; i++ )
          q[i] |= p[i];
      }

      p += bitmap->pitch;
    }

    bitmap->width += (FT_UInt)xstr;
    bitmap->rows += (FT_UInt)ystr;

    return FT_Err_Ok;
  }